

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O2

uint16 SIIcrc(uint8 *buf)

{
  long lVar1;
  uint8 crc;
  byte local_19;
  
  local_19 = 0xff;
  for (lVar1 = 0; (int)lVar1 != 0xe; lVar1 = lVar1 + 1) {
    calc_crc(&local_19,buf[lVar1]);
  }
  return (uint16)local_19;
}

Assistant:

uint16 SIIcrc(uint8 *buf)
{
   int i; 
   uint8 crc;
    
   crc = 0xff; 
   for( i = 0 ; i <= 13 ; i++ )
   {
      calc_crc(&crc , *(buf++));  
   } 
   return (uint16)crc;
}